

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

bool nite::mousePressed(uint Button)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = Button - 0xc9;
  if (uVar2 < 4) {
    if (isbuttonStatePressed[uVar2] != false) {
      return true;
    }
    if (buttonStatePressed[uVar2] == true) {
      if (buttonState[uVar2] == false) {
        bVar3 = false;
        bVar1 = false;
LAB_00177c47:
        buttonStatePressed[uVar2] = bVar3;
        return bVar1;
      }
    }
    else if (buttonState[uVar2] == true) {
      isbuttonStatePressed[uVar2] = true;
      bVar3 = true;
      bVar1 = true;
      goto LAB_00177c47;
    }
  }
  return false;
}

Assistant:

bool nite::mousePressed(unsigned Button){
	Button -= 201;
	if (Button >= niteButtonsn){
		return 0;
	}

	if (isbuttonStatePressed[Button]){
		return 1;
	}

	if (buttonStatePressed[Button] and buttonState[Button]){
		return 0;
	}

	if (buttonStatePressed[Button]){
		buttonStatePressed[Button] = 0;
		return 0;
	}

	if (!buttonStatePressed[Button] and buttonState[Button]){
		isbuttonStatePressed[Button] = 1;
		buttonStatePressed[Button] = 1;
		return 1;
	}

	return 0;
}